

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevkeyboardhandler.cpp
# Opt level: O0

bool __thiscall QEvdevKeyboardHandler::loadKeymap(QEvdevKeyboardHandler *this,QString *file)

{
  bool bVar1;
  Status SVar2;
  ulong uVar3;
  undefined8 uVar4;
  QMessageLogger *this_00;
  QString *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  quint32 i_1;
  quint32 i;
  Composing *qmap_keycompose;
  Mapping *qmap_keymap;
  quint32 qmap_keycompose_size;
  quint32 qmap_keymap_size;
  quint32 qmap_version;
  quint32 qmap_magic;
  QFile f;
  QDataStream ds;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  undefined4 in_stack_fffffffffffffeb8;
  OpenModeFlag in_stack_fffffffffffffebc;
  undefined4 in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffec4;
  char *in_stack_fffffffffffffec8;
  QEvdevKeyboardHandler *in_stack_fffffffffffffed0;
  char *local_128;
  uint local_118;
  uint local_114;
  bool local_e1;
  char local_e0 [32];
  char local_c0 [32];
  uint local_a0;
  uint local_9c;
  int local_98;
  int local_94;
  char local_90 [40];
  undefined8 local_68;
  undefined8 local_60;
  char local_58 [32];
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined1 local_10;
  undefined7 uStack_f;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaa;
  uStack_f = 0xaaaaaaaaaaaaaa;
  QtPrivateLogging::qLcEvdevKey();
  anon_unknown.dwarf_16dddd::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
            ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
             CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
             (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  while( true ) {
    bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                      ((QLoggingCategoryMacroHolder *)&local_18);
    if (!bVar1) break;
    anon_unknown.dwarf_16dddd::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x1433e3);
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
               in_stack_fffffffffffffec4,
               (char *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
               (char *)0x1433fc);
    QtPrivate::asString(in_RSI);
    uVar4 = QString::utf16();
    QMessageLogger::debug(local_58,"Loading keymap %ls",uVar4);
    local_10 = 0;
  }
  local_68 = 0xaaaaaaaaaaaaaaaa;
  local_60 = 0xaaaaaaaaaaaaaaaa;
  QFile::QFile((QFile *)&local_68,in_RSI);
  QFlags<QIODeviceBase::OpenModeFlag>::QFlags
            ((QFlags<QIODeviceBase::OpenModeFlag> *)
             CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),in_stack_fffffffffffffebc
            );
  uVar3 = QFile::open((QFlags_conflict *)&local_68);
  if ((uVar3 & 1) == 0) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
               in_stack_fffffffffffffec4,
               (char *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    QtPrivate::asString(in_RSI);
    uVar4 = QString::utf16();
    QMessageLogger::warning(local_90,"Could not open keymap file \'%ls\'",uVar4);
    local_e1 = false;
  }
  else {
    local_94 = -0x55555556;
    local_98 = -0x55555556;
    local_9c = 0xaaaaaaaa;
    local_a0 = 0xaaaaaaaa;
    local_38 = 0xaaaaaaaaaaaaaaaa;
    local_30 = 0xaaaaaaaaaaaaaaaa;
    local_28 = 0xaaaaaaaaaaaaaaaa;
    local_20 = 0xaaaaaaaaaaaaaaaa;
    QDataStream::QDataStream((QDataStream *)&local_38,(QIODevice *)&local_68);
    QDataStream::operator>>
              ((QDataStream *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
               (quint32 *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    QDataStream::operator>>
              ((QDataStream *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
               (quint32 *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    QDataStream::operator>>
              ((QDataStream *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
               (quint32 *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    QDataStream::operator>>
              ((QDataStream *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
               (quint32 *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    SVar2 = QDataStream::status((QDataStream *)&local_38);
    if ((((SVar2 == Ok) && (local_94 == 0x514d4150)) && (local_98 == 1)) && (local_9c != 0)) {
      uVar3 = SUB168(ZEXT416(local_9c) * ZEXT816(0xc),0);
      if (SUB168(ZEXT416(local_9c) * ZEXT816(0xc),8) != 0) {
        uVar3 = 0xffffffffffffffff;
      }
      this_00 = (QMessageLogger *)operator_new__(uVar3);
      if (local_a0 == 0) {
        local_128 = (char *)0x0;
      }
      else {
        uVar3 = SUB168(ZEXT416(local_a0) * ZEXT816(6),0);
        if (SUB168(ZEXT416(local_a0) * ZEXT816(6),8) != 0) {
          uVar3 = 0xffffffffffffffff;
        }
        local_128 = (char *)operator_new__(uVar3);
      }
      for (local_114 = 0; local_114 < local_9c; local_114 = local_114 + 1) {
        operator>>((QDataStream *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                   (Mapping *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      }
      for (local_118 = 0; local_118 < local_a0; local_118 = local_118 + 1) {
        operator>>((QDataStream *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                   (Composing *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      }
      SVar2 = QDataStream::status((QDataStream *)&local_38);
      if (SVar2 == Ok) {
        unloadKeymap(in_stack_fffffffffffffed0);
        *(QMessageLogger **)(in_RDI + 0x48) = this_00;
        *(uint *)(in_RDI + 0x50) = local_9c;
        *(char **)(in_RDI + 0x58) = local_128;
        *(uint *)(in_RDI + 0x60) = local_a0;
        *(undefined1 *)(in_RDI + 0x44) = 1;
        local_e1 = true;
      }
      else {
        if (this_00 != (QMessageLogger *)0x0) {
          operator_delete__(this_00);
        }
        if (local_128 != (char *)0x0) {
          operator_delete__(local_128);
        }
        QMessageLogger::QMessageLogger
                  (this_00,local_128,in_stack_fffffffffffffec4,
                   (char *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
        QtPrivate::asString(in_RSI);
        uVar4 = QString::utf16();
        QMessageLogger::warning(local_e0,"Keymap file \'%ls\' cannot be loaded.",uVar4);
        local_e1 = false;
      }
    }
    else {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                 in_stack_fffffffffffffec4,
                 (char *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      QtPrivate::asString(in_RSI);
      uVar4 = QString::utf16();
      QMessageLogger::warning(local_c0,"\'%ls\' is not a valid .qmap keymap file",uVar4);
      local_e1 = false;
    }
    QDataStream::~QDataStream((QDataStream *)&local_38);
  }
  QFile::~QFile((QFile *)&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_e1;
  }
  __stack_chk_fail();
}

Assistant:

bool QEvdevKeyboardHandler::loadKeymap(const QString &file)
{
    qCDebug(qLcEvdevKey, "Loading keymap %ls", qUtf16Printable(file));

    QFile f(file);

    if (!f.open(QIODevice::ReadOnly)) {
        qWarning("Could not open keymap file '%ls'", qUtf16Printable(file));
        return false;
    }

    // .qmap files have a very simple structure:
    // quint32 magic           (QKeyboard::FileMagic)
    // quint32 version         (1)
    // quint32 keymap_size     (# of struct QKeyboard::Mappings)
    // quint32 keycompose_size (# of struct QKeyboard::Composings)
    // all QKeyboard::Mappings via QDataStream::operator(<<|>>)
    // all QKeyboard::Composings via QDataStream::operator(<<|>>)

    quint32 qmap_magic, qmap_version, qmap_keymap_size, qmap_keycompose_size;

    QDataStream ds(&f);

    ds >> qmap_magic >> qmap_version >> qmap_keymap_size >> qmap_keycompose_size;

    if (ds.status() != QDataStream::Ok || qmap_magic != QKeyboardMap::FileMagic || qmap_version != 1 || qmap_keymap_size == 0) {
        qWarning("'%ls' is not a valid .qmap keymap file", qUtf16Printable(file));
        return false;
    }

    QKeyboardMap::Mapping *qmap_keymap = new QKeyboardMap::Mapping[qmap_keymap_size];
    QKeyboardMap::Composing *qmap_keycompose = qmap_keycompose_size ? new QKeyboardMap::Composing[qmap_keycompose_size] : 0;

    for (quint32 i = 0; i < qmap_keymap_size; ++i)
        ds >> qmap_keymap[i];
    for (quint32 i = 0; i < qmap_keycompose_size; ++i)
        ds >> qmap_keycompose[i];

    if (ds.status() != QDataStream::Ok) {
        delete [] qmap_keymap;
        delete [] qmap_keycompose;

        qWarning("Keymap file '%ls' cannot be loaded.", qUtf16Printable(file));
        return false;
    }

    // unload currently active and clear state
    unloadKeymap();

    m_keymap = qmap_keymap;
    m_keymap_size = qmap_keymap_size;
    m_keycompose = qmap_keycompose;
    m_keycompose_size = qmap_keycompose_size;

    m_do_compose = true;

    return true;
}